

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O0

int ecx_TxPDO(ecx_contextt *context,uint16 slave,uint16 TxPDOnumber,int *psize,void *p,int timeout)

{
  uint8 uVar1;
  ushort uVar2;
  int iVar3;
  uint8 local_848 [4];
  uint16 framedatasize;
  short sStack_842;
  uint8 cnt;
  ec_mbxbuft MbxOut;
  ec_mbxbuft MbxIn;
  int wkc;
  ec_SDOt *aSDOp;
  ec_SDOt *SDOp;
  int timeout_local;
  void *p_local;
  int *psize_local;
  uint16 TxPDOnumber_local;
  uint16 slave_local;
  ecx_contextt *context_local;
  
  ec_clearmbx((ec_mbxbuft *)(MbxOut + 0x3f8));
  ecx_mbxreceive(context,slave,(ec_mbxbuft *)(MbxOut + 0x3f8),0);
  ec_clearmbx((ec_mbxbuft *)local_848);
  local_848[0] = '\x02';
  local_848[1] = '\0';
  local_848[2] = '\0';
  local_848[3] = '\0';
  framedatasize._0_1_ = 0;
  uVar1 = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
  context->slavelist[slave].mbx_cnt = uVar1;
  framedatasize._1_1_ = uVar1 * '\x10' + '\x03';
  sStack_842 = (TxPDOnumber & 0x1ff) + 0x6000;
  MbxIn._1020_4_ = ecx_mbxsend(context,slave,(ec_mbxbuft *)local_848,20000);
  if (0 < (int)MbxIn._1020_4_) {
    ec_clearmbx((ec_mbxbuft *)(MbxOut + 0x3f8));
    MbxIn._1020_4_ = ecx_mbxreceive(context,slave,(ec_mbxbuft *)(MbxOut + 0x3f8),timeout);
    if (0 < (int)MbxIn._1020_4_) {
      if (((MbxOut[0x3fd] & 0xf) == 3) && ((int)(uint)(ushort)MbxOut._1022_2_ >> 0xc == 4)) {
        uVar2 = MbxOut._1016_2_ - 2;
        if (*psize < (int)(uint)uVar2) {
          MbxIn[0x3fc] = '\0';
          MbxIn[0x3fd] = '\0';
          MbxIn[0x3fe] = '\0';
          MbxIn[0x3ff] = '\0';
          ecx_packeterror(context,slave,0,'\0',3);
        }
        else {
          memcpy(p,MbxIn,(ulong)uVar2);
          *psize = (uint)uVar2;
        }
      }
      else {
        if (MbxIn[0] == 0x80) {
          ecx_SDOerror(context,slave,0,'\0',MbxIn._4_4_);
        }
        else {
          ecx_packeterror(context,slave,0,'\0',1);
        }
        MbxIn[0x3fc] = '\0';
        MbxIn[0x3fd] = '\0';
        MbxIn[0x3fe] = '\0';
        MbxIn[0x3ff] = '\0';
      }
    }
  }
  iVar3._0_1_ = MbxIn[0x3fc];
  iVar3._1_1_ = MbxIn[0x3fd];
  iVar3._2_1_ = MbxIn[0x3fe];
  iVar3._3_1_ = MbxIn[0x3ff];
  return iVar3;
}

Assistant:

int ecx_TxPDO(ecx_contextt *context, uint16 slave, uint16 TxPDOnumber , int *psize, void *p, int timeout)
{
   ec_SDOt *SDOp, *aSDOp;
   int wkc;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt;
   uint16 framedatasize;

   ec_clearmbx(&MbxIn);
   /* Empty slave out mailbox if something is in. Timout set to 0 */
   wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aSDOp = (ec_SDOt *)&MbxIn;
   SDOp = (ec_SDOt *)&MbxOut;
   SDOp->MbxHeader.length = htoes(0x02);
   SDOp->MbxHeader.address = htoes(0x0000);
   SDOp->MbxHeader.priority = 0x00;
   /* get new mailbox counter, used for session handle */
   cnt = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
   context->slavelist[slave].mbx_cnt = cnt;
   SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
   SDOp->CANOpen = htoes((TxPDOnumber & 0x01ff) + (ECT_COES_TXPDO_RR << 12)); /* number 9bits service upper 4 bits */
   wkc = ecx_mbxsend(context, slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
   if (wkc > 0)
   {
      /* clean mailboxbuffer */
      ec_clearmbx(&MbxIn);
      /* read slave response */
      wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, timeout);
      if (wkc > 0) /* succeeded to read slave response ? */
      {
         /* slave response should be CoE, TxPDO */
         if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) &&
             ((etohs(aSDOp->CANOpen) >> 12) == ECT_COES_TXPDO))
         {
            /* TxPDO response */
            framedatasize = (aSDOp->MbxHeader.length - 2);
            if (*psize >= framedatasize) /* parameter buffer big enough ? */
            {
               /* copy parameter in parameter buffer */
               memcpy(p, &aSDOp->Command, framedatasize);
               /* return the real parameter size */
               *psize = framedatasize;
            }
            /* parameter buffer too small */
            else
            {
               wkc = 0;
               ecx_packeterror(context, slave, 0, 0, 3); /*  data container too small for type */
            }
         }   
         /* other slave response */
         else
         {
            if ((aSDOp->Command) == ECT_SDO_ABORT) /* SDO abort frame received */
            {
               ecx_SDOerror(context, slave, 0, 0, etohl(aSDOp->ldata[0]));
            }
            else
            {
               ecx_packeterror(context, slave, 0, 0, 1); /* Unexpected frame returned */
            }
            wkc = 0;
         }
      }         
   }

   return wkc;
}